

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void get_loc_or_ref(DynBuf *bc,BOOL is_ref,int idx)

{
  uint8_t c;
  
  c = '^';
  if (is_ref == 0) {
    c = 'X';
  }
  dbuf_putc(bc,c);
  dbuf_put_u16(bc,(uint16_t)idx);
  return;
}

Assistant:

static void get_loc_or_ref(DynBuf *bc, BOOL is_ref, int idx)
{
    /* if the field is not initialized, the error is catched when
       accessing it */
    if (is_ref) 
        dbuf_putc(bc, OP_get_var_ref);
    else
        dbuf_putc(bc, OP_get_loc);
    dbuf_put_u16(bc, idx);
}